

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
* Parse(vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        *__return_storage_ptr__,string *descriptor,FlatSigningProvider *out,string *error,
       bool require_checksum)

{
  bool bVar1;
  pointer puVar2;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ret;
  uint32_t key_exp_index;
  Span<const_char> sp;
  _Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false> local_60;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  local_58;
  uint32_t local_3c;
  Span<const_char> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_data = (descriptor->_M_dataplus)._M_p;
  local_38.m_size = descriptor->_M_string_length;
  bVar1 = CheckChecksum(&local_38,require_checksum,error,(string *)0x0);
  if (bVar1) {
    local_3c = 0;
    anon_unknown.dwarf_2e4c4a4::ParseScript(&local_58,&local_3c,&local_38,TOP,out,error);
    if ((local_38.m_size == 0) &&
       (local_58.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::reserve(__return_storage_ptr__,
                (long)local_58.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      if (local_58.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_58.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar2 = local_58.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_60._M_head_impl =
               (puVar2->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl;
          (puVar2->_M_t).
          super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
          .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl =
               (DescriptorImpl *)0x0;
          std::
          vector<std::unique_ptr<Descriptor,std::default_delete<Descriptor>>,std::allocator<std::unique_ptr<Descriptor,std::default_delete<Descriptor>>>>
          ::emplace_back<std::unique_ptr<Descriptor,std::default_delete<Descriptor>>>
                    ((vector<std::unique_ptr<Descriptor,std::default_delete<Descriptor>>,std::allocator<std::unique_ptr<Descriptor,std::default_delete<Descriptor>>>>
                      *)__return_storage_ptr__,
                     (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)&local_60);
          if (local_60._M_head_impl != (DescriptorImpl *)0x0) {
            (*((local_60._M_head_impl)->super_Descriptor)._vptr_Descriptor[1])();
          }
          puVar2 = puVar2 + 1;
        } while (puVar2 != local_58.
                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    std::
    vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
    ::~vector(&local_58);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Descriptor>> Parse(const std::string& descriptor, FlatSigningProvider& out, std::string& error, bool require_checksum)
{
    Span<const char> sp{descriptor};
    if (!CheckChecksum(sp, require_checksum, error)) return {};
    uint32_t key_exp_index = 0;
    auto ret = ParseScript(key_exp_index, sp, ParseScriptContext::TOP, out, error);
    if (sp.size() == 0 && !ret.empty()) {
        std::vector<std::unique_ptr<Descriptor>> descs;
        descs.reserve(ret.size());
        for (auto& r : ret) {
            descs.emplace_back(std::unique_ptr<Descriptor>(std::move(r)));
        }
        return descs;
    }
    return {};
}